

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined4 uVar6;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  uint uVar33;
  _func_int *p_Var34;
  size_t sVar35;
  size_t sVar36;
  Layer *pLVar37;
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  unkbyte10 Var40;
  undefined1 auVar41 [14];
  undefined1 auVar42 [12];
  unkbyte10 Var43;
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [14];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [14];
  undefined1 auVar55 [12];
  undefined1 auVar56 [14];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  unkbyte10 Var59;
  int iVar60;
  int iVar61;
  int iVar62;
  byte bVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  ulong uVar67;
  _func_int *p_Var68;
  _func_int **pp_Var69;
  int iVar70;
  int iVar71;
  int iVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  uint uVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  undefined8 *puVar80;
  uint uVar81;
  void *pvVar82;
  void *pvVar83;
  undefined8 *puVar84;
  int iVar85;
  int outw;
  int iVar86;
  uint uVar87;
  int iVar88;
  void *pvVar89;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar103;
  char cVar104;
  int iVar102;
  int iVar105;
  int iVar106;
  undefined1 auVar90 [16];
  int iVar117;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  int iVar118;
  float fVar119;
  undefined1 auVar120 [12];
  int iVar131;
  int iVar132;
  int iVar133;
  undefined1 auVar121 [16];
  undefined1 auVar129 [16];
  int iVar135;
  short sVar136;
  int iVar137;
  undefined1 auVar134 [16];
  int iVar138;
  undefined4 uVar139;
  short sVar145;
  undefined1 auVar152 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  short sVar179;
  int iVar176;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  int iVar185;
  short sVar188;
  short sVar191;
  undefined1 auVar189 [12];
  short sVar194;
  undefined1 auVar192 [12];
  int w;
  ulong local_220;
  void *local_210;
  float local_1fc;
  void *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  int local_1dc;
  Mat *local_1d8;
  void *local_1d0;
  Option opt_q;
  ulong local_170;
  ulong local_168;
  float scale_out;
  Mat local_158;
  Mat local_108;
  long local_c0;
  long local_b8;
  void *local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  Mat local_78;
  undefined7 uVar8;
  undefined6 uVar10;
  undefined5 uVar12;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined3 uVar21;
  undefined3 uVar22;
  undefined3 uVar23;
  undefined2 uVar27;
  undefined2 uVar28;
  undefined2 uVar29;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined6 uVar140;
  undefined8 uVar141;
  undefined1 auVar142 [12];
  undefined1 auVar143 [14];
  undefined1 auVar144 [16];
  undefined4 uVar146;
  undefined6 uVar147;
  undefined8 uVar148;
  undefined1 auVar149 [12];
  undefined1 auVar150 [14];
  undefined1 auVar151 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [12];
  undefined1 auVar178 [16];
  undefined1 auVar186 [12];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  
  local_78.elempack = bottom_blob->elempack;
  local_78.elemsize = bottom_blob->elemsize;
  local_78.data = bottom_blob->data;
  local_78.refcount = bottom_blob->refcount;
  local_78.allocator = bottom_blob->allocator;
  local_78.dims = bottom_blob->dims;
  local_78.w = bottom_blob->w;
  local_78.h = bottom_blob->h;
  local_78.d = bottom_blob->d;
  local_78.c = bottom_blob->c;
  local_78.cstep = bottom_blob->cstep;
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + 1;
    UNLOCK();
  }
  if (local_78.elempack == 0 || ((int)local_78.elemsize * 8) / local_78.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    uVar4 = opt->workspace_allocator;
    uVar6 = opt->openmp_blocktime;
    uVar13 = opt->use_winograd_convolution;
    uVar18 = opt->use_sgemm_convolution;
    uVar24 = opt->use_int8_inference;
    uVar30 = opt->use_vulkan_compute;
    uVar27 = CONCAT11(uVar30,uVar24);
    uVar21 = CONCAT21(uVar27,uVar18);
    uVar16 = CONCAT31(uVar21,uVar13);
    auVar107[0] = opt->use_bf16_storage;
    auVar107[1] = opt->use_fp16_packed;
    auVar107[2] = opt->use_fp16_storage;
    auVar107[3] = opt->use_fp16_arithmetic;
    auVar107[4] = opt->use_int8_packed;
    auVar107[5] = opt->use_int8_storage;
    auVar107[6] = opt->use_int8_arithmetic;
    auVar107[7] = opt->use_packing_layout;
    uVar5 = opt->use_shader_pack8;
    uVar7 = opt->use_subgroup_basic;
    uVar9 = opt->use_subgroup_vote;
    uVar11 = opt->use_subgroup_ballot;
    uVar14 = opt->use_subgroup_shuffle;
    uVar19 = opt->use_image_storage;
    uVar25 = opt->use_tensor_storage;
    uVar31 = opt->use_weight_fp16_storage;
    uVar28 = CONCAT11(uVar31,uVar25);
    uVar22 = CONCAT21(uVar28,uVar19);
    uVar17 = CONCAT31(uVar22,uVar14);
    uVar12 = CONCAT41(uVar17,uVar11);
    uVar10 = CONCAT51(uVar12,uVar9);
    uVar8 = CONCAT61(uVar10,uVar7);
    auVar107._8_8_ = CONCAT71(uVar8,uVar5);
    auVar129._0_4_ = opt->flush_denormals;
    auVar129[4] = opt->use_local_pool_allocator;
    auVar129[5] = opt->use_reserved_1;
    auVar129[6] = opt->use_reserved_2;
    auVar129[7] = opt->use_reserved_3;
    auVar129[8] = opt->use_reserved_4;
    auVar129[9] = opt->use_reserved_5;
    auVar129[10] = opt->use_reserved_6;
    auVar129[0xb] = opt->use_reserved_7;
    uVar15 = opt->use_reserved_8;
    uVar20 = opt->use_reserved_9;
    uVar26 = opt->use_reserved_10;
    uVar32 = opt->use_reserved_11;
    uVar29 = CONCAT11(uVar32,uVar26);
    uVar23 = CONCAT21(uVar29,uVar20);
    auVar129._12_4_ = CONCAT31(uVar23,uVar15);
    opt_q._48_12_ = auVar129._0_12_;
    opt_q._32_8_ = auVar107._0_8_;
    opt_q._40_4_ = SUB84(auVar107._8_8_,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.workspace_allocator = (Allocator *)uVar4;
    opt_q.openmp_blocktime = uVar6;
    opt_q._28_4_ = uVar16;
    opt_q._44_4_ = uVar17;
    opt_q._60_4_ = auVar129._12_4_;
    quantize_to_int8(bottom_blob,&local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),&opt_q);
  }
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),&local_78,
             &local_108,opt);
  iVar66 = local_108.elempack;
  iVar88 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((local_108.data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     local_108.cstep * (long)local_108.c == 0)) goto LAB_00187915;
  p_Var68 = this->_vptr_Convolution_x86[-3];
  iVar85 = (~((*(int *)(p_Var68 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           local_108.w) / *(int *)(p_Var68 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data)
           + 1;
  iVar86 = (~((*(int *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           local_108.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var68) + 1;
  bVar63 = (*(uint *)(p_Var68 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) & 3) == 0 &
           opt->use_packing_layout;
  uVar87 = (uint)bVar63 + (uint)bVar63 * 2 + 1;
  local_1dc = *(int *)(p_Var68 + 0x18 + (long)&(this->weight_data_int8).data);
  uVar76 = ((uint)bVar63 + (uint)bVar63 * 2) * 4 + 4;
  uVar33 = uVar76;
  if (100 < local_1dc) {
    uVar33 = uVar87;
  }
  local_c0 = (long)local_108.c;
  Mat::create(top_blob,iVar85,iVar86,
              (int)*(uint *)(p_Var68 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) /
              (int)uVar87,(ulong)uVar33,uVar87,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    iVar88 = -100;
    goto LAB_00187915;
  }
  iVar88 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((long)top_blob->c * top_blob->cstep == 0) goto LAB_00187915;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  Mat::create(&local_158,iVar85,iVar86,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / (int)uVar87,(ulong)uVar76,
              uVar87,opt->workspace_allocator);
  iVar105 = local_108.c;
  iVar102 = local_108.w;
  iVar86 = local_158.h;
  iVar85 = local_158.w;
  iVar88 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((local_158.data != (void *)0x0) &&
     (local_1d8 = (Mat *)(long)local_158.c,
     opt_q.blob_allocator =
          (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     local_158.cstep * (long)local_1d8 != 0)) {
    if (iVar66 == 8 && bVar63 == 1) {
      p_Var68 = this->_vptr_Convolution_x86[-3];
      uVar76 = *(uint *)(p_Var68 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if (((ulong)uVar76 == 1) &&
         (*(int *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) {
        if ((*(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1) &&
           (((*(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var68 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var68) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse(&local_108,&local_158,&this->weight_data_int8,opt);
        }
        else {
          if ((((*(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
               (*(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
              (*(int *)(p_Var68 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2)) ||
             (*(int *)((long)&this->convolution_dilation1 + (long)p_Var68) != 2)) goto LAB_0018615c;
          conv1x1s2_pack8to4_int8_sse(&local_108,&local_158,&this->weight_data_int8,opt);
        }
      }
      else {
LAB_0018615c:
        uVar33 = *(uint *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar88 = *(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        local_1f8 = (void *)(long)*(int *)(p_Var68 + 0x40 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        iVar106 = *(int *)(p_Var68 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        local_1f0 = (ulong)*(int *)((long)&this->convolution_dilation1 + (long)p_Var68);
        uVar74 = (ulong)(uint)local_108.c;
        uVar79 = (ulong)(uint)local_158.w;
        uVar73 = (ulong)(uint)local_158.h;
        if (opt->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_weight_fp16_storage = false;
          opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
          Mat::create((Mat *)&opt_q,local_158.h * local_158.w,uVar76 * uVar33,local_108.c,8,8,
                      opt->workspace_allocator);
          local_1d8 = &this->weight_data_int8;
          if (0 < iVar105) {
            iVar102 = iVar102 * (int)local_1f0;
            local_1d0 = local_108.data;
            local_1f0._0_1_ = opt_q.lightmode;
            local_1f0._1_3_ = opt_q._1_3_;
            local_1f0._4_4_ = opt_q.num_threads;
            local_1e8 = (long)local_108.w * (long)local_1f8;
            local_220 = 0;
            do {
              if (0 < (int)uVar33) {
                local_1f8 = (void *)(local_108.elemsize * local_1e8);
                uVar73 = 0;
                puVar84 = (undefined8 *)opt_q._0_8_;
                do {
                  if (0 < (int)uVar76) {
                    uVar67 = 0;
                    do {
                      if (0 < iVar86) {
                        puVar80 = (undefined8 *)
                                  ((long)local_108.data +
                                  uVar67 * (long)iVar88 * 8 +
                                  (long)local_1f8 * uVar73 +
                                  local_108.cstep * local_220 * local_108.elemsize);
                        uVar87 = 0;
                        do {
                          uVar75 = uVar79;
                          if (0 < iVar85) {
                            do {
                              *puVar84 = *puVar80;
                              puVar84 = puVar84 + 1;
                              puVar80 = puVar80 + iVar106;
                              uVar81 = (int)uVar75 - 1;
                              uVar75 = (ulong)uVar81;
                            } while (uVar81 != 0);
                          }
                          puVar80 = puVar80 + (iVar102 - iVar85 * iVar106);
                          uVar87 = uVar87 + 1;
                        } while (uVar87 != iVar86);
                      }
                      uVar67 = uVar67 + 1;
                    } while (uVar67 != uVar76);
                  }
                  uVar73 = uVar73 + 1;
                } while (uVar73 != uVar33);
              }
              local_220 = local_220 + 1;
            } while (local_220 != uVar74);
          }
          im2col_sgemm_pack8to4_int8_sse
                    ((Mat *)&opt_q,&local_158,local_1d8,(Option *)opt->workspace_allocator);
          piVar1 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (opt_q._32_8_ == 0) {
                if (opt_q._0_8_ != 0) {
                  free((void *)opt_q._0_8_);
                }
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
          uVar87 = uVar76 * uVar33;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar87,
                     (allocator_type *)&local_1fc);
          if (0 < (int)uVar33) {
            iVar64 = 0;
            iVar65 = 0;
            uVar81 = 0;
            do {
              if (0 < (int)uVar76) {
                lVar77 = 0;
                do {
                  *(int *)(opt_q._0_8_ + (long)iVar64 * 4 + lVar77 * 4) = iVar65;
                  iVar65 = iVar65 + iVar88;
                  lVar77 = lVar77 + 1;
                } while (uVar76 != (uint)lVar77);
                iVar64 = iVar64 + (uint)lVar77;
              }
              iVar65 = iVar65 + (iVar102 * (int)local_1f8 - iVar88 * uVar76);
              uVar81 = uVar81 + 1;
            } while (uVar81 != uVar33);
          }
          if (0 < (int)local_1d8) {
            local_1d0 = (void *)((long)iVar85 * 4);
            local_220 = 0;
            do {
              if (0 < iVar86) {
                _w = (void *)(local_158.cstep * local_220 * local_158.elemsize +
                             (long)local_158.data);
                local_1e8 = 0;
                do {
                  if (0 < iVar85) {
                    local_1f8 = (void *)(local_1e8 * local_1f0);
                    uVar67 = 0;
                    do {
                      if (iVar105 < 1) {
                        iVar118 = 0;
                        iVar131 = 0;
                        iVar132 = 0;
                        iVar133 = 0;
                        iVar70 = 0;
                        iVar71 = 0;
                        iVar72 = 0;
                        iVar117 = 0;
                        auVar134 = (undefined1  [16])0x0;
                        iVar88 = 0;
                        iVar102 = 0;
                        iVar64 = 0;
                        iVar65 = 0;
                      }
                      else {
                        pvVar82 = (void *)((this->weight_data_int8).cstep * local_220 *
                                           (this->weight_data_int8).elemsize +
                                          (long)(this->weight_data_int8).data);
                        iVar88 = 0;
                        iVar102 = 0;
                        iVar64 = 0;
                        iVar65 = 0;
                        uVar75 = 0;
                        auVar134 = (undefined1  [16])0x0;
                        iVar70 = 0;
                        iVar71 = 0;
                        iVar72 = 0;
                        iVar117 = 0;
                        iVar118 = 0;
                        iVar131 = 0;
                        iVar132 = 0;
                        iVar133 = 0;
                        do {
                          if (0 < (int)uVar87) {
                            lVar77 = 0;
                            do {
                              uVar3 = *(ulong *)((long)local_108.data +
                                                (long)*(int *)(opt_q._0_8_ + lVar77) * 8 +
                                                local_108.cstep * local_108.elemsize * uVar75 +
                                                (long)(iVar106 * 8 * (int)uVar67) +
                                                (long)local_108.w * (long)local_1f8 *
                                                local_108.elemsize);
                              cVar98 = (char)(uVar3 >> 8);
                              cVar99 = (char)(uVar3 >> 0x10);
                              cVar100 = (char)(uVar3 >> 0x18);
                              cVar101 = (char)(uVar3 >> 0x20);
                              cVar103 = (char)(uVar3 >> 0x28);
                              cVar104 = (char)(uVar3 >> 0x30);
                              auVar175._8_6_ = 0;
                              auVar175._0_8_ = uVar3;
                              auVar175[0xe] = (char)(uVar3 >> 0x38);
                              auVar175[0xf] = -((long)uVar3 < 0);
                              auVar174._14_2_ = auVar175._14_2_;
                              auVar174._8_5_ = 0;
                              auVar174._0_8_ = uVar3;
                              auVar174[0xd] = -(cVar104 < '\0');
                              auVar173._13_3_ = auVar174._13_3_;
                              auVar173._8_4_ = 0;
                              auVar173._0_8_ = uVar3;
                              auVar173[0xc] = cVar104;
                              auVar172._12_4_ = auVar173._12_4_;
                              auVar172._8_3_ = 0;
                              auVar172._0_8_ = uVar3;
                              auVar172[0xb] = -(cVar103 < '\0');
                              auVar171._11_5_ = auVar172._11_5_;
                              auVar171._8_2_ = 0;
                              auVar171._0_8_ = uVar3;
                              auVar171[10] = cVar103;
                              auVar170._10_6_ = auVar171._10_6_;
                              auVar170[8] = 0;
                              auVar170._0_8_ = uVar3;
                              auVar170[9] = -(cVar101 < '\0');
                              auVar169._9_7_ = auVar170._9_7_;
                              auVar169[8] = cVar101;
                              auVar169._0_8_ = uVar3;
                              Var40 = CONCAT91(CONCAT81(auVar169._8_8_,-(cVar100 < '\0')),cVar100);
                              auVar39._2_10_ = Var40;
                              auVar39[1] = -(cVar99 < '\0');
                              auVar39[0] = cVar99;
                              auVar38._2_12_ = auVar39;
                              auVar38[1] = -(cVar98 < '\0');
                              auVar38[0] = cVar98;
                              auVar168._0_2_ = CONCAT11(-((char)uVar3 < '\0'),(char)uVar3);
                              auVar168._2_14_ = auVar38;
                              auVar107 = *(undefined1 (*) [16])((long)pvVar82 + lVar77 * 8);
                              auVar129 = *(undefined1 (*) [16])((long)pvVar82 + lVar77 * 8 + 0x10);
                              auVar166._0_14_ = auVar107._0_14_;
                              auVar166[0xe] = auVar107[7];
                              auVar166[0xf] = -(auVar107[7] < '\0');
                              auVar165._14_2_ = auVar166._14_2_;
                              auVar165._0_13_ = auVar107._0_13_;
                              auVar165[0xd] = -(auVar107[6] < '\0');
                              auVar164._13_3_ = auVar165._13_3_;
                              auVar164._0_12_ = auVar107._0_12_;
                              auVar164[0xc] = auVar107[6];
                              auVar163._12_4_ = auVar164._12_4_;
                              auVar163._0_11_ = auVar107._0_11_;
                              auVar163[0xb] = -(auVar107[5] < '\0');
                              auVar162._11_5_ = auVar163._11_5_;
                              auVar162._0_10_ = auVar107._0_10_;
                              auVar162[10] = auVar107[5];
                              auVar161._10_6_ = auVar162._10_6_;
                              auVar161._0_9_ = auVar107._0_9_;
                              auVar161[9] = -(auVar107[4] < '\0');
                              auVar160._9_7_ = auVar161._9_7_;
                              auVar160._0_8_ = auVar107._0_8_;
                              auVar160[8] = auVar107[4];
                              Var43 = CONCAT91(CONCAT81(auVar160._8_8_,-(auVar107[3] < '\0')),
                                               auVar107[3]);
                              auVar42._2_10_ = Var43;
                              auVar42[1] = -(auVar107[2] < '\0');
                              auVar42[0] = auVar107[2];
                              auVar41._2_12_ = auVar42;
                              auVar41[1] = -(auVar107[1] < '\0');
                              auVar41[0] = auVar107[1];
                              auVar159._0_2_ = CONCAT11(-(auVar107[0] < '\0'),auVar107[0]);
                              auVar159._2_14_ = auVar41;
                              sVar145 = CONCAT11(-(auVar107[8] < '\0'),auVar107[8]);
                              uVar146 = CONCAT13(-(auVar107[9] < '\0'),CONCAT12(auVar107[9],sVar145)
                                                );
                              uVar147 = CONCAT15(-(auVar107[10] < '\0'),
                                                 CONCAT14(auVar107[10],uVar146));
                              uVar148 = CONCAT17(-(auVar107[0xb] < '\0'),
                                                 CONCAT16(auVar107[0xb],uVar147));
                              auVar149._0_10_ =
                                   CONCAT19(-(auVar107[0xc] < '\0'),CONCAT18(auVar107[0xc],uVar148))
                              ;
                              auVar149[10] = auVar107[0xd];
                              auVar149[0xb] = -(auVar107[0xd] < '\0');
                              auVar150[0xc] = auVar107[0xe];
                              auVar150._0_12_ = auVar149;
                              auVar150[0xd] = -(auVar107[0xe] < '\0');
                              auVar151[0xe] = auVar107[0xf];
                              auVar151._0_14_ = auVar150;
                              auVar151[0xf] = -(auVar107[0xf] < '\0');
                              auVar157._0_14_ = auVar129._0_14_;
                              auVar157[0xe] = auVar129[7];
                              auVar157[0xf] = -(auVar129[7] < '\0');
                              auVar156._14_2_ = auVar157._14_2_;
                              auVar156._0_13_ = auVar129._0_13_;
                              auVar156[0xd] = -(auVar129[6] < '\0');
                              auVar155._13_3_ = auVar156._13_3_;
                              auVar155._0_12_ = auVar129._0_12_;
                              auVar155[0xc] = auVar129[6];
                              auVar167._12_4_ = auVar155._12_4_;
                              auVar167._0_11_ = auVar129._0_11_;
                              auVar167[0xb] = -(auVar129[5] < '\0');
                              auVar154._11_5_ = auVar167._11_5_;
                              auVar154._0_10_ = auVar129._0_10_;
                              auVar154[10] = auVar129[5];
                              auVar158._10_6_ = auVar154._10_6_;
                              auVar158._0_9_ = auVar129._0_9_;
                              auVar158[9] = -(auVar129[4] < '\0');
                              auVar153._9_7_ = auVar158._9_7_;
                              auVar153._0_8_ = auVar129._0_8_;
                              auVar153[8] = auVar129[4];
                              Var46 = CONCAT91(CONCAT81(auVar153._8_8_,-(auVar129[3] < '\0')),
                                               auVar129[3]);
                              auVar45._2_10_ = Var46;
                              auVar45[1] = -(auVar129[2] < '\0');
                              auVar45[0] = auVar129[2];
                              auVar44._2_12_ = auVar45;
                              auVar44[1] = -(auVar129[1] < '\0');
                              auVar44[0] = auVar129[1];
                              auVar152._0_2_ = CONCAT11(-(auVar129[0] < '\0'),auVar129[0]);
                              auVar152._2_14_ = auVar44;
                              sVar136 = CONCAT11(-(auVar129[8] < '\0'),auVar129[8]);
                              uVar139 = CONCAT13(-(auVar129[9] < '\0'),CONCAT12(auVar129[9],sVar136)
                                                );
                              uVar140 = CONCAT15(-(auVar129[10] < '\0'),
                                                 CONCAT14(auVar129[10],uVar139));
                              uVar141 = CONCAT17(-(auVar129[0xb] < '\0'),
                                                 CONCAT16(auVar129[0xb],uVar140));
                              auVar142._0_10_ =
                                   CONCAT19(-(auVar129[0xc] < '\0'),CONCAT18(auVar129[0xc],uVar141))
                              ;
                              auVar142[10] = auVar129[0xd];
                              auVar142[0xb] = -(auVar129[0xd] < '\0');
                              auVar143[0xc] = auVar129[0xe];
                              auVar143._0_12_ = auVar142;
                              auVar143[0xd] = -(auVar129[0xe] < '\0');
                              auVar144[0xe] = auVar129[0xf];
                              auVar144._0_14_ = auVar143;
                              auVar144[0xf] = -(auVar129[0xf] < '\0');
                              sVar179 = auVar38._0_2_;
                              sVar180 = auVar39._0_2_;
                              sVar194 = (short)Var40;
                              sVar181 = sVar194 * (short)Var43;
                              sVar182 = auVar169._8_2_;
                              sVar183 = auVar171._10_2_;
                              sVar184 = auVar173._12_2_;
                              auVar167 = pmulhw(auVar159,auVar168);
                              sVar188 = sVar194 * (short)((ulong)uVar148 >> 0x30);
                              auVar129 = pmulhw(auVar151,auVar168);
                              sVar191 = sVar194 * (short)Var46;
                              auVar158 = pmulhw(auVar152,auVar168);
                              sVar194 = sVar194 * (short)((ulong)uVar141 >> 0x30);
                              auVar107 = pmulhw(auVar144,auVar168);
                              iVar185 = CONCAT22(auVar167._6_2_,sVar181);
                              Var40 = CONCAT64(CONCAT42(iVar185,auVar167._4_2_),
                                               CONCAT22(sVar180 * auVar42._0_2_,sVar181));
                              auVar47._4_8_ = (long)((unkuint10)Var40 >> 0x10);
                              auVar47._2_2_ = auVar167._2_2_;
                              auVar47._0_2_ = sVar179 * auVar41._0_2_;
                              iVar60 = CONCAT22(auVar129._6_2_,sVar188);
                              Var43 = CONCAT64(CONCAT42(iVar60,auVar129._4_2_),
                                               CONCAT22(sVar180 * (short)((uint6)uVar147 >> 0x20),
                                                        sVar188));
                              auVar48._4_8_ = (long)((unkuint10)Var43 >> 0x10);
                              auVar48._2_2_ = auVar129._2_2_;
                              auVar48._0_2_ = sVar179 * (short)((uint)uVar146 >> 0x10);
                              iVar135 = auVar134._4_4_;
                              iVar137 = auVar134._8_4_;
                              iVar138 = auVar134._12_4_;
                              iVar61 = CONCAT22(auVar158._6_2_,sVar191);
                              Var46 = CONCAT64(CONCAT42(iVar61,auVar158._4_2_),
                                               CONCAT22(sVar180 * auVar45._0_2_,sVar191));
                              auVar49._4_8_ = (long)((unkuint10)Var46 >> 0x10);
                              auVar49._2_2_ = auVar158._2_2_;
                              auVar49._0_2_ = sVar179 * auVar44._0_2_;
                              iVar62 = CONCAT22(auVar107._6_2_,sVar194);
                              Var59 = CONCAT64(CONCAT42(iVar62,auVar107._4_2_),
                                               CONCAT22(sVar180 * (short)((uint6)uVar140 >> 0x20),
                                                        sVar194));
                              auVar50._4_8_ = (long)((unkuint10)Var59 >> 0x10);
                              auVar50._2_2_ = auVar107._2_2_;
                              auVar50._0_2_ = sVar179 * (short)((uint)uVar139 >> 0x10);
                              iVar176 = CONCAT22(auVar167._8_2_,sVar182 * auVar160._8_2_);
                              auVar177._0_8_ =
                                   CONCAT26(auVar167._10_2_,
                                            CONCAT24(sVar183 * auVar162._10_2_,iVar176));
                              auVar177._8_2_ = sVar184 * auVar164._12_2_;
                              auVar177._10_2_ = auVar167._12_2_;
                              auVar178._12_2_ = auVar174._14_2_ * auVar165._14_2_;
                              auVar178._0_12_ = auVar177;
                              auVar178._14_2_ = auVar167._14_2_;
                              iVar88 = iVar176 + CONCAT22(auVar167._0_2_,
                                                          auVar168._0_2_ * auVar159._0_2_) + iVar88;
                              iVar102 = (int)((ulong)auVar177._0_8_ >> 0x20) +
                                        auVar47._0_4_ + iVar102;
                              iVar64 = auVar177._8_4_ + (int)((unkuint10)Var40 >> 0x10) + iVar64;
                              iVar65 = auVar178._12_4_ + iVar185 + iVar65;
                              iVar185 = CONCAT22(auVar129._8_2_,
                                                 sVar182 * (short)((unkuint10)auVar149._0_10_ >>
                                                                  0x40));
                              auVar186._0_8_ =
                                   CONCAT26(auVar129._10_2_,
                                            CONCAT24(sVar183 * auVar149._10_2_,iVar185));
                              auVar186._8_2_ = sVar184 * auVar150._12_2_;
                              auVar186._10_2_ = auVar129._12_2_;
                              auVar187._12_2_ = auVar174._14_2_ * auVar151._14_2_;
                              auVar187._0_12_ = auVar186;
                              auVar187._14_2_ = auVar129._14_2_;
                              auVar134._0_4_ =
                                   iVar185 + CONCAT22(auVar129._0_2_,auVar168._0_2_ * sVar145) +
                                             auVar134._0_4_;
                              auVar134._4_4_ =
                                   (int)((ulong)auVar186._0_8_ >> 0x20) + auVar48._0_4_ + iVar135;
                              auVar134._8_4_ =
                                   auVar186._8_4_ + (int)((unkuint10)Var43 >> 0x10) + iVar137;
                              auVar134._12_4_ = auVar187._12_4_ + iVar60 + iVar138;
                              iVar185 = CONCAT22(auVar158._8_2_,sVar182 * auVar153._8_2_);
                              auVar189._0_8_ =
                                   CONCAT26(auVar158._10_2_,
                                            CONCAT24(sVar183 * auVar154._10_2_,iVar185));
                              auVar189._8_2_ = sVar184 * auVar155._12_2_;
                              auVar189._10_2_ = auVar158._12_2_;
                              auVar190._12_2_ = auVar174._14_2_ * auVar156._14_2_;
                              auVar190._0_12_ = auVar189;
                              auVar190._14_2_ = auVar158._14_2_;
                              iVar70 = iVar185 + CONCAT22(auVar158._0_2_,
                                                          auVar168._0_2_ * auVar152._0_2_) + iVar70;
                              iVar71 = (int)((ulong)auVar189._0_8_ >> 0x20) + auVar49._0_4_ + iVar71
                              ;
                              iVar72 = auVar189._8_4_ + (int)((unkuint10)Var46 >> 0x10) + iVar72;
                              iVar117 = auVar190._12_4_ + iVar61 + iVar117;
                              iVar185 = CONCAT22(auVar107._8_2_,
                                                 sVar182 * (short)((unkuint10)auVar142._0_10_ >>
                                                                  0x40));
                              auVar192._0_8_ =
                                   CONCAT26(auVar107._10_2_,
                                            CONCAT24(sVar183 * auVar142._10_2_,iVar185));
                              auVar192._8_2_ = sVar184 * auVar143._12_2_;
                              auVar192._10_2_ = auVar107._12_2_;
                              auVar193._12_2_ = auVar174._14_2_ * auVar144._14_2_;
                              auVar193._0_12_ = auVar192;
                              auVar193._14_2_ = auVar107._14_2_;
                              iVar118 = iVar185 + CONCAT22(auVar107._0_2_,auVar168._0_2_ * sVar136)
                                                  + iVar118;
                              iVar131 = (int)((ulong)auVar192._0_8_ >> 0x20) +
                                        auVar50._0_4_ + iVar131;
                              iVar132 = auVar192._8_4_ + (int)((unkuint10)Var59 >> 0x10) + iVar132;
                              iVar133 = auVar193._12_4_ + iVar62 + iVar133;
                              lVar77 = lVar77 + 4;
                            } while ((ulong)uVar87 << 2 != lVar77);
                            pvVar82 = (void *)((long)pvVar82 + (ulong)uVar87 * 0x20);
                          }
                          uVar75 = uVar75 + 1;
                        } while (uVar75 != uVar74);
                      }
                      piVar1 = (int *)((long)_w + uVar67 * 0x10);
                      *piVar1 = iVar65 + iVar64 + iVar102 + iVar88;
                      piVar1[1] = auVar134._12_4_ + auVar134._8_4_ + auVar134._4_4_ + auVar134._0_4_
                      ;
                      piVar1[2] = iVar117 + iVar72 + iVar71 + iVar70;
                      piVar1[3] = iVar133 + iVar132 + iVar131 + iVar118;
                      uVar67 = uVar67 + 1;
                    } while (uVar67 != uVar79);
                  }
                  _w = (void *)((long)_w + (long)iVar85 * 0x10);
                  local_1e8 = local_1e8 + 1;
                } while (local_1e8 != uVar73);
              }
              local_220 = local_220 + 1;
            } while ((Mat *)local_220 != local_1d8);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
        }
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q.use_bf16_storage = false;
      opt_q.use_fp16_packed = false;
      opt_q.use_fp16_storage = false;
      opt_q.use_fp16_arithmetic = false;
      opt_q.use_int8_packed = false;
      opt_q.use_int8_storage = false;
      opt_q.use_int8_arithmetic = false;
      opt_q.use_packing_layout = false;
      opt_q.use_shader_pack8 = false;
      opt_q.use_subgroup_basic = false;
      opt_q.use_subgroup_vote = false;
      opt_q.use_subgroup_ballot = false;
      opt_q.use_subgroup_shuffle = false;
      opt_q.use_image_storage = false;
      opt_q.use_tensor_storage = false;
      opt_q.use_weight_fp16_storage = false;
      opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var69 = this->_vptr_Convolution_x86;
      p_Var34 = pp_Var69[-3];
      p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
      if (0 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar77 = 0;
        do {
          fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
          fVar119 = 0.0;
          if (fVar2 != 0.0) {
            fVar119 = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar77 * 4) = fVar119;
          lVar77 = lVar77 + 1;
          p_Var34 = pp_Var69[-3];
          p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
        } while (lVar77 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
        ;
      }
      if (local_1dc < 0x65) {
        dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x1a8),opt);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x280),
                   (Mat *)(p_Var68 + 0x1a8),*(int *)(p_Var68 + 0x10c),(Mat *)(p_Var68 + 0x110),opt);
      }
      piVar1 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar86 = local_108.c;
    iVar85 = local_108.w;
    iVar88 = local_158.w;
    if (iVar66 == 1 && bVar63 == 1) {
      p_Var68 = this->_vptr_Convolution_x86[-3];
      iVar102 = *(int *)(p_Var68 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar105 = *(int *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar106 = *(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar64 = *(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1f8 = (void *)(long)*(int *)(p_Var68 + 0x44 +
                                        (long)&(this->weight_data_3x3_winograd63).data);
      local_1f0 = (ulong)*(int *)((long)&this->convolution_dilation1 + (long)p_Var68);
      uVar73 = (ulong)(uint)local_108.c;
      lVar77 = (long)local_158.w;
      local_1e8 = (ulong)(uint)local_158.h;
      local_1d8 = (Mat *)(ulong)(uint)local_158.c;
      uVar76 = iVar102 * iVar105;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar76,
                 (allocator_type *)&local_1fc);
      if (0 < iVar105) {
        iVar65 = 0;
        iVar70 = 0;
        iVar71 = 0;
        do {
          if (0 < iVar102) {
            lVar78 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar65 * 4 + lVar78 * 4) = iVar70;
              iVar70 = iVar70 + iVar106;
              lVar78 = lVar78 + 1;
            } while (iVar102 != (int)lVar78);
            iVar65 = iVar65 + (int)lVar78;
          }
          iVar70 = iVar70 + (iVar85 * iVar64 - iVar106 * iVar102);
          iVar71 = iVar71 + 1;
        } while (iVar71 != iVar105);
      }
      if (0 < (int)local_1d8) {
        local_1d0 = (void *)(lVar77 * 4);
        _w = (void *)0x0;
        do {
          if (0 < (int)local_1e8) {
            pvVar82 = (void *)(local_158.cstep * (long)_w * local_158.elemsize +
                              (long)local_158.data);
            local_220 = 0;
            do {
              if (0 < iVar88) {
                lVar78 = 0;
                do {
                  if (iVar86 < 1) {
                    iVar85 = 0;
                    iVar102 = 0;
                    iVar105 = 0;
                    iVar106 = 0;
                  }
                  else {
                    pvVar89 = (void *)((this->weight_data_int8).cstep * (long)_w *
                                       (this->weight_data_int8).elemsize +
                                      (long)(this->weight_data_int8).data);
                    iVar85 = 0;
                    iVar102 = 0;
                    iVar105 = 0;
                    iVar106 = 0;
                    uVar74 = 0;
                    do {
                      if (0 < (int)uVar76) {
                        uVar79 = 0;
                        do {
                          auVar107 = ZEXT416((uint)(int)*(char *)((long)local_108.data +
                                                                 (long)*(int *)(opt_q._0_8_ +
                                                                               uVar79 * 4) +
                                                                 local_108.cstep *
                                                                 local_108.elemsize * uVar74 +
                                                                 lVar78 * (long)local_1f8 +
                                                                 (long)local_108.w *
                                                                 local_220 * local_1f0 *
                                                                 local_108.elemsize));
                          auVar107 = pshuflw(auVar107,auVar107,0);
                          auVar108._0_4_ = auVar107._0_4_;
                          auVar108._4_4_ = auVar108._0_4_;
                          auVar108._8_4_ = auVar108._0_4_;
                          auVar108._12_4_ = auVar108._0_4_;
                          uVar67 = *(ulong *)((long)pvVar89 + uVar79 * 4);
                          cVar98 = (char)(uVar67 >> 8);
                          cVar99 = (char)(uVar67 >> 0x10);
                          cVar100 = (char)(uVar67 >> 0x18);
                          cVar101 = (char)(uVar67 >> 0x20);
                          cVar103 = (char)(uVar67 >> 0x28);
                          cVar104 = (char)(uVar67 >> 0x30);
                          auVar128._8_6_ = 0;
                          auVar128._0_8_ = uVar67;
                          auVar128[0xe] = (char)(uVar67 >> 0x38);
                          auVar128[0xf] = -((long)uVar67 < 0);
                          auVar127._14_2_ = auVar128._14_2_;
                          auVar127._8_5_ = 0;
                          auVar127._0_8_ = uVar67;
                          auVar127[0xd] = -(cVar104 < '\0');
                          auVar126._13_3_ = auVar127._13_3_;
                          auVar126._8_4_ = 0;
                          auVar126._0_8_ = uVar67;
                          auVar126[0xc] = cVar104;
                          auVar125._12_4_ = auVar126._12_4_;
                          auVar125._8_3_ = 0;
                          auVar125._0_8_ = uVar67;
                          auVar125[0xb] = -(cVar103 < '\0');
                          auVar124._11_5_ = auVar125._11_5_;
                          auVar124._8_2_ = 0;
                          auVar124._0_8_ = uVar67;
                          auVar124[10] = cVar103;
                          auVar123._10_6_ = auVar124._10_6_;
                          auVar123[8] = 0;
                          auVar123._0_8_ = uVar67;
                          auVar123[9] = -(cVar101 < '\0');
                          auVar122._9_7_ = auVar123._9_7_;
                          auVar122[8] = cVar101;
                          auVar122._0_8_ = uVar67;
                          Var40 = CONCAT91(CONCAT81(auVar122._8_8_,-(cVar100 < '\0')),cVar100);
                          auVar52._2_10_ = Var40;
                          auVar52[1] = -(cVar99 < '\0');
                          auVar52[0] = cVar99;
                          auVar51._2_12_ = auVar52;
                          auVar51[1] = -(cVar98 < '\0');
                          auVar51[0] = cVar98;
                          auVar121._0_2_ = CONCAT11(-((char)uVar67 < '\0'),(char)uVar67);
                          auVar121._2_14_ = auVar51;
                          sVar136 = auVar107._2_2_ * (short)Var40;
                          auVar129 = pmulhw(auVar121,auVar108);
                          iVar64 = CONCAT22(auVar129._6_2_,sVar136);
                          Var40 = CONCAT64(CONCAT42(iVar64,auVar129._4_2_),
                                           CONCAT22(auVar107._0_2_ * auVar52._0_2_,sVar136));
                          auVar53._4_8_ = (long)((unkuint10)Var40 >> 0x10);
                          auVar53._2_2_ = auVar129._2_2_;
                          auVar53._0_2_ = auVar107._2_2_ * auVar51._0_2_;
                          iVar85 = iVar85 + CONCAT22(auVar129._0_2_,auVar107._0_2_ * auVar121._0_2_)
                          ;
                          iVar102 = iVar102 + auVar53._0_4_;
                          iVar105 = iVar105 + (int)((unkuint10)Var40 >> 0x10);
                          iVar106 = iVar106 + iVar64;
                          uVar79 = uVar79 + 1;
                        } while (uVar76 != uVar79);
                        pvVar89 = (void *)((long)pvVar89 + (ulong)uVar76 * 4);
                      }
                      uVar74 = uVar74 + 1;
                    } while (uVar74 != uVar73);
                  }
                  piVar1 = (int *)((long)pvVar82 + lVar78 * 0x10);
                  *piVar1 = iVar85;
                  piVar1[1] = iVar102;
                  piVar1[2] = iVar105;
                  piVar1[3] = iVar106;
                  lVar78 = lVar78 + 1;
                } while (lVar78 != lVar77);
              }
              pvVar82 = (void *)((long)pvVar82 + lVar77 * 0x10);
              local_220 = local_220 + 1;
            } while (local_220 != local_1e8);
          }
          _w = (void *)((long)_w + 1);
        } while ((Mat *)_w != local_1d8);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q.use_bf16_storage = false;
      opt_q.use_fp16_packed = false;
      opt_q.use_fp16_storage = false;
      opt_q.use_fp16_arithmetic = false;
      opt_q.use_int8_packed = false;
      opt_q.use_int8_storage = false;
      opt_q.use_int8_arithmetic = false;
      opt_q.use_packing_layout = false;
      opt_q.use_shader_pack8 = false;
      opt_q.use_subgroup_basic = false;
      opt_q.use_subgroup_vote = false;
      opt_q.use_subgroup_ballot = false;
      opt_q.use_subgroup_shuffle = false;
      opt_q.use_image_storage = false;
      opt_q.use_tensor_storage = false;
      opt_q.use_weight_fp16_storage = false;
      opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var69 = this->_vptr_Convolution_x86;
      p_Var34 = pp_Var69[-3];
      p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
      if (0 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar77 = 0;
        do {
          fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
          fVar119 = 0.0;
          if (fVar2 != 0.0) {
            fVar119 = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar77 * 4) = fVar119;
          lVar77 = lVar77 + 1;
          p_Var34 = pp_Var69[-3];
          p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
        } while (lVar77 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
        ;
      }
      if (local_1dc < 0x65) {
        dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x1a8),opt);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x280),
                   (Mat *)(p_Var68 + 0x1a8),*(int *)(p_Var68 + 0x10c),(Mat *)(p_Var68 + 0x110),opt);
      }
      piVar1 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar102 = local_108.c;
    iVar86 = local_108.w;
    iVar85 = local_158.c;
    iVar88 = local_158.w;
    if ((iVar66 == 8) && (bVar63 != 1)) {
      p_Var68 = this->_vptr_Convolution_x86[-3];
      iVar105 = *(int *)(p_Var68 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar106 = *(int *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar64 = *(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar65 = *(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1e8 = CONCAT44(local_1e8._4_4_,
                           *(undefined4 *)
                            (p_Var68 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data));
      local_1d8 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var68);
      uVar74 = (ulong)(uint)local_108.c;
      lVar77 = (long)local_158.w;
      local_1f0 = (ulong)(uint)local_158.h;
      uVar73 = (ulong)(uint)local_158.c;
      uVar76 = iVar105 * iVar106;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar76,
                 (allocator_type *)&local_1fc);
      if (0 < iVar106) {
        iVar70 = 0;
        iVar71 = 0;
        iVar72 = 0;
        do {
          if (0 < iVar105) {
            lVar78 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar70 * 4 + lVar78 * 4) = iVar71;
              iVar71 = iVar71 + iVar64;
              lVar78 = lVar78 + 1;
            } while (iVar105 != (int)lVar78);
            iVar70 = iVar70 + (int)lVar78;
          }
          iVar71 = iVar71 + (iVar86 * iVar65 - iVar64 * iVar105);
          iVar72 = iVar72 + 1;
        } while (iVar72 != iVar106);
      }
      if (0 < iVar85) {
        local_b0 = local_158.data;
        local_b8 = local_158.elemsize * local_158.cstep;
        iVar85 = (int)local_1e8 * 8;
        local_1e8 = CONCAT44(local_1e8._4_4_,iVar85);
        local_168 = 0;
        do {
          if (0 < (int)local_1f0) {
            sVar35 = (this->weight_data_int8).cstep;
            sVar36 = (this->weight_data_int8).elemsize;
            pvVar82 = (void *)(local_b8 * local_168 + (long)local_158.data);
            pvVar89 = (this->weight_data_int8).data;
            local_1d0 = (void *)0x0;
            do {
              if (0 < iVar88) {
                local_1f8 = (void *)((long)local_1d0 * (long)local_1d8 * local_108.elemsize);
                lVar78 = 0;
                do {
                  if (iVar102 < 1) {
                    iVar86 = 0;
                  }
                  else {
                    uVar79 = 0;
                    iVar86 = 0;
                    pvVar83 = (void *)(sVar35 * local_168 * sVar36 + (long)pvVar89);
                    do {
                      if (0 < (int)uVar76) {
                        uVar67 = 0;
                        do {
                          uVar75 = *(ulong *)((long)local_108.data +
                                             (long)*(int *)(opt_q._0_8_ + uVar67 * 4) * 8 +
                                             local_108.cstep * local_108.elemsize * uVar79 +
                                             (long)local_108.w * (long)local_1f8 +
                                             (long)(iVar85 * (int)lVar78));
                          cVar98 = (char)(uVar75 >> 8);
                          cVar99 = (char)(uVar75 >> 0x10);
                          cVar100 = (char)(uVar75 >> 0x18);
                          cVar101 = (char)(uVar75 >> 0x20);
                          cVar103 = (char)(uVar75 >> 0x28);
                          cVar104 = (char)(uVar75 >> 0x30);
                          auVar97._8_6_ = 0;
                          auVar97._0_8_ = uVar75;
                          auVar97[0xe] = (char)(uVar75 >> 0x38);
                          auVar97[0xf] = -((long)uVar75 < 0);
                          auVar96._14_2_ = auVar97._14_2_;
                          auVar96._8_5_ = 0;
                          auVar96._0_8_ = uVar75;
                          auVar96[0xd] = -(cVar104 < '\0');
                          auVar95._13_3_ = auVar96._13_3_;
                          auVar95._8_4_ = 0;
                          auVar95._0_8_ = uVar75;
                          auVar95[0xc] = cVar104;
                          auVar94._12_4_ = auVar95._12_4_;
                          auVar94._8_3_ = 0;
                          auVar94._0_8_ = uVar75;
                          auVar94[0xb] = -(cVar103 < '\0');
                          auVar93._11_5_ = auVar94._11_5_;
                          auVar93._8_2_ = 0;
                          auVar93._0_8_ = uVar75;
                          auVar93[10] = cVar103;
                          auVar92._10_6_ = auVar93._10_6_;
                          auVar92[8] = 0;
                          auVar92._0_8_ = uVar75;
                          auVar92[9] = -(cVar101 < '\0');
                          auVar91._9_7_ = auVar92._9_7_;
                          auVar91[8] = cVar101;
                          auVar91._0_8_ = uVar75;
                          Var40 = CONCAT91(CONCAT81(auVar91._8_8_,-(cVar100 < '\0')),cVar100);
                          auVar55._2_10_ = Var40;
                          auVar55[1] = -(cVar99 < '\0');
                          auVar55[0] = cVar99;
                          auVar54._2_12_ = auVar55;
                          auVar54[1] = -(cVar98 < '\0');
                          auVar54[0] = cVar98;
                          auVar90._0_2_ = CONCAT11(-((char)uVar75 < '\0'),(char)uVar75);
                          auVar90._2_14_ = auVar54;
                          uVar75 = *(ulong *)((long)pvVar83 + uVar67 * 8);
                          cVar98 = (char)(uVar75 >> 8);
                          cVar99 = (char)(uVar75 >> 0x10);
                          cVar100 = (char)(uVar75 >> 0x18);
                          cVar101 = (char)(uVar75 >> 0x20);
                          cVar103 = (char)(uVar75 >> 0x28);
                          cVar104 = (char)(uVar75 >> 0x30);
                          auVar116._8_6_ = 0;
                          auVar116._0_8_ = uVar75;
                          auVar116[0xe] = (char)(uVar75 >> 0x38);
                          auVar116[0xf] = -((long)uVar75 < 0);
                          auVar115._14_2_ = auVar116._14_2_;
                          auVar115._8_5_ = 0;
                          auVar115._0_8_ = uVar75;
                          auVar115[0xd] = -(cVar104 < '\0');
                          auVar114._13_3_ = auVar115._13_3_;
                          auVar114._8_4_ = 0;
                          auVar114._0_8_ = uVar75;
                          auVar114[0xc] = cVar104;
                          auVar113._12_4_ = auVar114._12_4_;
                          auVar113._8_3_ = 0;
                          auVar113._0_8_ = uVar75;
                          auVar113[0xb] = -(cVar103 < '\0');
                          auVar112._11_5_ = auVar113._11_5_;
                          auVar112._8_2_ = 0;
                          auVar112._0_8_ = uVar75;
                          auVar112[10] = cVar103;
                          auVar111._10_6_ = auVar112._10_6_;
                          auVar111[8] = 0;
                          auVar111._0_8_ = uVar75;
                          auVar111[9] = -(cVar101 < '\0');
                          auVar110._9_7_ = auVar111._9_7_;
                          auVar110[8] = cVar101;
                          auVar110._0_8_ = uVar75;
                          Var43 = CONCAT91(CONCAT81(auVar110._8_8_,-(cVar100 < '\0')),cVar100);
                          auVar57._2_10_ = Var43;
                          auVar57[1] = -(cVar99 < '\0');
                          auVar57[0] = cVar99;
                          auVar56._2_12_ = auVar57;
                          auVar56[1] = -(cVar98 < '\0');
                          auVar56[0] = cVar98;
                          auVar109._0_2_ = CONCAT11(-((char)uVar75 < '\0'),(char)uVar75);
                          auVar109._2_14_ = auVar56;
                          sVar136 = (short)Var43 * (short)Var40;
                          auVar107 = pmulhw(auVar109,auVar90);
                          iVar105 = CONCAT22(auVar107._6_2_,sVar136);
                          Var40 = CONCAT64(CONCAT42(iVar105,auVar107._4_2_),
                                           CONCAT22(auVar57._0_2_ * auVar55._0_2_,sVar136));
                          auVar58._4_8_ = (long)((unkuint10)Var40 >> 0x10);
                          auVar58._2_2_ = auVar107._2_2_;
                          auVar58._0_2_ = auVar56._0_2_ * auVar54._0_2_;
                          iVar106 = CONCAT22(auVar107._8_2_,auVar110._8_2_ * auVar91._8_2_);
                          auVar120._0_8_ =
                               CONCAT26(auVar107._10_2_,
                                        CONCAT24(auVar112._10_2_ * auVar93._10_2_,iVar106));
                          auVar120._8_2_ = auVar114._12_2_ * auVar95._12_2_;
                          auVar120._10_2_ = auVar107._12_2_;
                          auVar130._12_2_ = auVar115._14_2_ * auVar96._14_2_;
                          auVar130._0_12_ = auVar120;
                          auVar130._14_2_ = auVar107._14_2_;
                          iVar86 = iVar86 + auVar130._12_4_ + iVar105 +
                                            (int)((ulong)auVar120._0_8_ >> 0x20) + auVar58._0_4_ +
                                            auVar120._8_4_ + (int)((unkuint10)Var40 >> 0x10) +
                                            iVar106 + CONCAT22(auVar107._0_2_,
                                                               auVar109._0_2_ * auVar90._0_2_);
                          uVar67 = uVar67 + 1;
                        } while (uVar76 != uVar67);
                        pvVar83 = (void *)((long)pvVar83 + (ulong)uVar76 * 8);
                      }
                      uVar79 = uVar79 + 1;
                    } while (uVar79 != uVar74);
                  }
                  *(int *)((long)pvVar82 + lVar78 * 4) = iVar86;
                  lVar78 = lVar78 + 1;
                } while (lVar78 != lVar77);
              }
              pvVar82 = (void *)((long)pvVar82 + lVar77 * 4);
              local_1d0 = (void *)((long)local_1d0 + 1);
            } while (local_1d0 != (void *)local_1f0);
          }
          local_168 = local_168 + 1;
        } while (local_168 != uVar73);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q.use_bf16_storage = false;
      opt_q.use_fp16_packed = false;
      opt_q.use_fp16_storage = false;
      opt_q.use_fp16_arithmetic = false;
      opt_q.use_int8_packed = false;
      opt_q.use_int8_storage = false;
      opt_q.use_int8_arithmetic = false;
      opt_q.use_packing_layout = false;
      opt_q.use_shader_pack8 = false;
      opt_q.use_subgroup_basic = false;
      opt_q.use_subgroup_vote = false;
      opt_q.use_subgroup_ballot = false;
      opt_q.use_subgroup_shuffle = false;
      opt_q.use_image_storage = false;
      opt_q.use_tensor_storage = false;
      opt_q.use_weight_fp16_storage = false;
      opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var69 = this->_vptr_Convolution_x86;
      p_Var34 = pp_Var69[-3];
      p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
      if (0 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar77 = 0;
        do {
          fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
          fVar119 = 0.0;
          if (fVar2 != 0.0) {
            fVar119 = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar77 * 4) = fVar119;
          lVar77 = lVar77 + 1;
          p_Var34 = pp_Var69[-3];
          p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
        } while (lVar77 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
        ;
      }
      if (local_1dc < 0x65) {
        dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x1a8),opt);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x280),
                   (Mat *)(p_Var68 + 0x1a8),*(int *)(p_Var68 + 0x10c),(Mat *)(p_Var68 + 0x110),opt);
      }
      piVar1 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar102 = local_108.c;
    iVar86 = local_158.c;
    iVar85 = local_158.w;
    iVar88 = 0;
    if (bVar63 == 0 && iVar66 == 1) {
      pp_Var69 = this->_vptr_Convolution_x86;
      if (((((opt->use_winograd_convolution == true) &&
            (p_Var68 = pp_Var69[-3],
            *(int *)(p_Var68 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
          ((*(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           (*(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         (((*(int *)(p_Var68 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           ((*(int *)((long)&this->convolution_dilation1 + (long)p_Var68) == 1 &&
            (0xf < iVar66 * (int)local_c0)))) &&
          (0xf < *(int *)(p_Var68 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))) {
        conv3x3s1_winograd23_int8_sse
                  (&local_108,&local_158,&this->weight_data_3x3_winograd23_int8,opt);
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_weight_fp16_storage = false;
        opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var69 = this->_vptr_Convolution_x86;
        p_Var34 = pp_Var69[-3];
        p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
        if (0 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar77 = 0;
          do {
            fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
            fVar119 = 0.0;
            if (fVar2 != 0.0) {
              fVar119 = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar77 * 4) = fVar119;
            lVar77 = lVar77 + 1;
            p_Var34 = pp_Var69[-3];
            p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
          } while (lVar77 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data
                                    ));
        }
        if (local_1dc < 0x65) {
          dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x1a8),opt);
          pLVar37 = this->activation;
          if (pLVar37 != (Layer *)0x0) {
            (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x280),
                     (Mat *)(p_Var68 + 0x1a8),*(int *)(p_Var68 + 0x10c),(Mat *)(p_Var68 + 0x110),opt
                    );
        }
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        p_Var68 = pp_Var69[-3];
        iVar66 = *(int *)(p_Var68 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        if ((((opt->use_sgemm_convolution == true) && (iVar66 == 1)) &&
            (iVar66 = 1,
            *(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(uint *)(p_Var68 + 0x1c + (long)&(this->weight_data_int8).data) < 2)) {
          if (local_1dc < 0x65) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)pp_Var69[-3]);
            if (0 < *(int *)(pp_Var69[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
            {
              lVar77 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
                local_1fc = 0.0;
                if (fVar2 != 0.0) {
                  local_1fc = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_1fc);
                  pp_Var69 = this->_vptr_Convolution_x86;
                }
                else {
                  *(float *)opt_q.blob_allocator = local_1fc;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar77 = lVar77 + 1;
                p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)pp_Var69[-3]);
              } while (lVar77 < *(int *)(pp_Var69[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar66 = *(int *)(p_Var68 + 0xd4);
            iVar85 = *(int *)(p_Var68 + 0xd8);
            iVar86 = *(int *)(p_Var68 + 0xe4);
            iVar102 = *(int *)(p_Var68 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_dequant_sse
                      (&local_108,top_blob,*(Mat **)(p_Var68 + 0x160),iVar66,iVar85,iVar86,iVar102,
                       *(Mat **)(p_Var68 + 0x1a8),&local_a8,opt);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)pp_Var69[-3]);
            if (0 < *(int *)(pp_Var69[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
            {
              lVar77 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
                local_1fc = 0.0;
                if (fVar2 != 0.0) {
                  local_1fc = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
                }
                scale_out = **(float **)(p_Var68 + 0x280);
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_1fc);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_1fc;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&scale_out);
                }
                else {
                  *(float *)opt_q.blob_allocator = scale_out;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar77 = lVar77 + 1;
                p_Var68 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86 +
                          (long)this->_vptr_Convolution_x86[-3]);
              } while (lVar77 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar66 = *(int *)(p_Var68 + 0xd4);
            iVar85 = *(int *)(p_Var68 + 0xd8);
            iVar86 = *(int *)(p_Var68 + 0xe4);
            iVar102 = *(int *)(p_Var68 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_requant_sse
                      (&local_108,top_blob,*(Mat **)(p_Var68 + 0x160),iVar66,iVar85,iVar86,iVar102,
                       *(Mat **)(p_Var68 + 0x1a8),&local_90,opt);
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
          pLVar37 = this->activation;
          if (pLVar37 != (Layer *)0x0) {
            (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
            iVar88 = 0;
          }
          goto LAB_001878d9;
        }
        iVar88 = *(int *)(p_Var68 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar105 = *(int *)(p_Var68 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar106 = *(int *)(p_Var68 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_1d0 = (void *)(long)*(int *)(p_Var68 + 0x44 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        iVar64 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var68);
        local_1f8 = (void *)CONCAT44(local_1f8._4_4_,local_108.w);
        uVar74 = (ulong)(uint)local_108.c;
        lVar77 = (long)local_158.w;
        local_1d8 = (Mat *)(ulong)(uint)local_158.h;
        uVar73 = (ulong)(uint)local_158.c;
        uVar76 = iVar88 * iVar105;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar76,
                   (allocator_type *)&local_1fc);
        if (0 < iVar105) {
          iVar65 = 0;
          iVar70 = 0;
          iVar71 = 0;
          do {
            if (0 < iVar88) {
              lVar78 = 0;
              do {
                *(int *)(opt_q._0_8_ + (long)iVar65 * 4 + lVar78 * 4) = iVar71;
                iVar71 = iVar71 + iVar66;
                lVar78 = lVar78 + 1;
              } while (iVar88 != (int)lVar78);
              iVar65 = iVar65 + (int)lVar78;
            }
            iVar71 = iVar71 + ((int)local_1f8 * iVar106 - iVar66 * iVar88);
            iVar70 = iVar70 + 1;
          } while (iVar70 != iVar105);
        }
        if (0 < iVar86) {
          local_b0 = local_158.data;
          local_b8 = local_158.elemsize * local_158.cstep;
          iVar66 = iVar102 * uVar76;
          local_c0 = CONCAT44(local_c0._4_4_,iVar66);
          local_170 = 0;
          do {
            if (0 < (int)local_1d8) {
              local_210 = (void *)(local_b8 * local_170 + (long)local_158.data);
              local_1e8 = (long)(iVar66 * (int)local_170) +
                          *(long *)(p_Var68 + 0x28 +
                                   (long)&(this->weight_data_3x3_winograd23_int8).data);
              local_1f0 = 0;
              do {
                if (0 < iVar85) {
                  local_1f8 = local_108.data;
                  lVar78 = 0;
                  do {
                    if (iVar102 < 1) {
                      iVar88 = 0;
                    }
                    else {
                      uVar67 = 0;
                      iVar88 = 0;
                      uVar79 = local_1e8;
                      do {
                        if (0 < (int)uVar76) {
                          uVar75 = 0;
                          do {
                            iVar88 = iVar88 + (int)*(char *)(uVar79 + uVar75) *
                                              (int)*(char *)((long)local_108.data +
                                                            (long)*(int *)(opt_q._0_8_ + uVar75 * 4)
                                                            + local_108.cstep * local_108.elemsize *
                                                              uVar67 + (long)local_108.w *
                                                                       local_1f0 * (long)iVar64 *
                                                                       local_108.elemsize +
                                                                       lVar78 * (long)local_1d0);
                            uVar75 = uVar75 + 1;
                          } while (uVar76 != uVar75);
                        }
                        uVar79 = uVar79 + (long)(int)uVar76;
                        uVar67 = uVar67 + 1;
                      } while (uVar67 != uVar74);
                    }
                    *(int *)((long)local_210 + lVar78 * 4) = iVar88;
                    lVar78 = lVar78 + 1;
                  } while (lVar78 != lVar77);
                }
                local_210 = (void *)((long)local_210 + lVar77 * 4);
                local_1f0 = local_1f0 + 1;
              } while ((Mat *)local_1f0 != local_1d8);
            }
            local_170 = local_170 + 1;
          } while (local_170 != uVar73);
        }
        if (opt_q._0_8_ != 0) {
          operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
        }
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_weight_fp16_storage = false;
        opt_q._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var69 = this->_vptr_Convolution_x86;
        p_Var34 = pp_Var69[-3];
        p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
        if (0 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar77 = 0;
          do {
            fVar2 = *(float *)(*(long *)(p_Var68 + 0x1f0) + lVar77 * 4);
            fVar119 = 0.0;
            if (fVar2 != 0.0) {
              fVar119 = 1.0 / (fVar2 * **(float **)(p_Var68 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar77 * 4) = fVar119;
            lVar77 = lVar77 + 1;
            p_Var34 = pp_Var69[-3];
            p_Var68 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var34);
          } while (lVar77 < *(int *)(p_Var34 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data
                                    ));
        }
        if (local_1dc < 0x65) {
          dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x1a8),opt);
          pLVar37 = this->activation;
          if (pLVar37 != (Layer *)0x0) {
            (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var68 + 0x280),
                     (Mat *)(p_Var68 + 0x1a8),*(int *)(p_Var68 + 0x10c),(Mat *)(p_Var68 + 0x110),opt
                    );
        }
        piVar1 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (opt_q._32_8_ == 0) {
              if (opt_q._0_8_ != 0) {
                free((void *)opt_q._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
      iVar88 = 0;
    }
  }
LAB_001878d9:
  piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00187915:
  piVar1 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar88;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}